

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O0

void secp256k1_fe_impl_inv_var(secp256k1_fe *r,secp256k1_fe *x)

{
  void *in_RSI;
  secp256k1_modinv64_signed62 s;
  secp256k1_fe tmp;
  secp256k1_modinv64_modinfo *in_stack_00000088;
  secp256k1_modinv64_signed62 *in_stack_00000090;
  secp256k1_modinv64_signed62 sStack_68;
  undefined1 local_40 [8];
  secp256k1_modinv64_signed62 *in_stack_ffffffffffffffc8;
  secp256k1_fe *in_stack_ffffffffffffffd0;
  
  memcpy(local_40,in_RSI,0x30);
  secp256k1_fe_normalize_var((secp256k1_fe *)0x12158c);
  secp256k1_fe_to_signed62(&sStack_68,(secp256k1_fe *)local_40);
  secp256k1_modinv64_var(in_stack_00000090,in_stack_00000088);
  secp256k1_fe_from_signed62(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

static void secp256k1_fe_impl_inv_var(secp256k1_fe *r, const secp256k1_fe *x) {
    secp256k1_fe tmp = *x;
    secp256k1_modinv64_signed62 s;

    secp256k1_fe_normalize_var(&tmp);
    secp256k1_fe_to_signed62(&s, &tmp);
    secp256k1_modinv64_var(&s, &secp256k1_const_modinfo_fe);
    secp256k1_fe_from_signed62(r, &s);
}